

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<2,_152>::verifySize(int NREAC,int NSIGZ,int NUNR,int NW)

{
  undefined8 *puVar1;
  
  if ((NSIGZ * NREAC + 1) * NUNR + NSIGZ == NW) {
    return;
  }
  tools::Log::error<char_const*>("Inconsistent data size");
  tools::Log::info<char_const*>("Expected NW = ( NREAC * NSIGZ + 1 ) * NUNR + NSIGZ");
  tools::Log::info<char_const*,int>("NW value: {}",NW);
  tools::Log::info<char_const*,int>("NREAC value: {}",NREAC);
  tools::Log::info<char_const*,int>("NSIGZ value: {}",NSIGZ);
  tools::Log::info<char_const*,int>("NUNR value: {}",NUNR);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NREAC, int NSIGZ, int NUNR, int NW ) {

  if ( NW != ( NREAC * NSIGZ + 1 ) * NUNR + NSIGZ )  {

    Log::error( "Inconsistent data size" );
    Log::info( "Expected NW = ( NREAC * NSIGZ + 1 ) * NUNR + NSIGZ" );
    Log::info( "NW value: {}", NW );
    Log::info( "NREAC value: {}", NREAC );
    Log::info( "NSIGZ value: {}", NSIGZ );
    Log::info( "NUNR value: {}", NUNR );
    throw std::exception();
  }
}